

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::checkForNamedInterface(CoreBroker *this,ActionMessage *command)

{
  byte *pbVar1;
  uint16_t flags;
  GlobalHandle target;
  GlobalHandle target_00;
  GlobalHandle target_01;
  GlobalHandle fed_id;
  GlobalHandle GVar2;
  GlobalHandle target_02;
  GlobalHandle fed_id_00;
  GlobalHandle target_03;
  GlobalHandle target_04;
  GlobalHandle fed_id_01;
  GlobalHandle target_05;
  GlobalHandle fed_id_02;
  size_type sVar3;
  size_type sVar4;
  undefined1 auVar5 [16];
  string_view type;
  string_view message;
  string_view units;
  ushort uVar6;
  BasicHandleInfo *pBVar7;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var8;
  string *psVar9;
  BasicHandleInfo *pBVar10;
  InterfaceType what;
  action_t aVar11;
  InterfaceHandle IVar12;
  GlobalFederateId fed_id_03;
  char *pcVar13;
  string_view str;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view name;
  string_view string1;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view string1_00;
  string_view name_03;
  string_view name_04;
  string_view string1_01;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view string1_02;
  string_view name_05;
  string_view string2;
  string_view string2_00;
  string_view string2_01;
  string_view name_06;
  string_view string2_02;
  size_t sVar14;
  char *pcVar15;
  size_t sVar16;
  char *pcVar17;
  GlobalFederateId local_7c;
  undefined8 local_78;
  char *pcStack_70;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_40;
  size_t local_38;
  char *pcStack_30;
  
  flags = command->flags;
  if ((-1 < (char)flags) || ((this->super_BrokerBase).field_0x294 != '\x01')) goto LAB_002801f3;
  aVar11 = command->messageAction;
  switch(aVar11) {
  case cmd_add_named_input:
    target.fed_id.gid = (command->source_id).gid;
    target.handle.hid = (command->source_handle).hid;
    key._M_str = (char *)(command->payload).heap;
    key._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectableInput(&this->unknownHandles,key,target,flags);
    break;
  case cmd_add_named_filter:
    target_01.fed_id.gid = (command->source_id).gid;
    target_01.handle.hid = (command->source_handle).hid;
    key_02._M_str = (char *)(command->payload).heap;
    key_02._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectableFilter(&this->unknownHandles,key_02,target_01,flags);
    break;
  case cmd_add_named_publication:
    target_00.fed_id.gid = (command->source_id).gid;
    target_00.handle.hid = (command->source_handle).hid;
    key_00._M_str = (char *)(command->payload).heap;
    key_00._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectablePublication(&this->unknownHandles,key_00,target_00,flags);
    break;
  case cmd_add_named_endpoint:
    GVar2.fed_id.gid = (command->source_id).gid;
    GVar2.handle.hid = (command->source_handle).hid;
    key_01._M_str = (char *)(command->payload).heap;
    key_01._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectableEndpoint(&this->unknownHandles,key_01,GVar2,flags);
    break;
  default:
    goto switchD_00280173_default;
  }
LAB_002801f3:
  aVar11 = command->messageAction;
switchD_00280173_default:
  switch(aVar11) {
  case cmd_add_named_input:
    name._M_str = (char *)(command->payload).heap;
    name._M_len = (command->payload).bufferSize;
    pBVar7 = HandleManager::getInterfaceHandle(&this->handles,name,INPUT);
    if (pBVar7 != (BasicHandleInfo *)0x0) {
      local_7c.gid = (pBVar7->handle).fed_id.gid;
      _Var8 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::find(&this->mFederates,&local_7c);
      if ((_Var8._M_current)->state < ERROR_STATE) {
        ActionMessage::setAction(command,cmd_add_publisher);
        IVar12.hid = (pBVar7->handle).handle.hid;
        command->dest_id = (GlobalFederateId)(pBVar7->handle).fed_id.gid;
        command->dest_handle = (InterfaceHandle)IVar12.hid;
        fed_id.fed_id.gid = (command->source_id).gid;
        fed_id.handle.hid = (command->source_handle).hid;
        pBVar10 = HandleManager::findHandle(&this->handles,fed_id);
        if (pBVar10 != (BasicHandleInfo *)0x0) {
          string1._M_str = (pBVar10->type)._M_dataplus._M_p;
          string1._M_len = (pBVar10->type)._M_string_length;
          string2._M_str = (pBVar10->units)._M_dataplus._M_p;
          string2._M_len = (pBVar10->units)._M_string_length;
          ActionMessage::setStringData(command,string1,string2);
        }
        (command->payload).bufferSize = 0;
        routeMessage(this,command);
        ActionMessage::setAction(command,cmd_add_subscriber);
        ActionMessage::swapSourceDest(command);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&command->stringData);
        name_00._M_str = (pBVar7->key)._M_dataplus._M_p;
        name_00._M_len = (pBVar7->key)._M_string_length;
        ActionMessage::name(command,name_00);
        goto LAB_00280802;
      }
      aVar11 = cmd_add_subscriber;
LAB_002805a5:
      ActionMessage::setAction(command,aVar11);
      *(byte *)&command->flags = (byte)command->flags | 0x10;
      ActionMessage::swapSourceDest(command);
      IVar12.hid = (pBVar7->handle).handle.hid;
      command->source_id = (GlobalFederateId)(pBVar7->handle).fed_id.gid;
      command->source_handle = (InterfaceHandle)IVar12.hid;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&command->stringData);
LAB_00280802:
      routeMessage(this,command);
      return;
    }
    break;
  case cmd_add_named_filter:
    name_04._M_str = (char *)(command->payload).heap;
    name_04._M_len = (command->payload).bufferSize;
    pBVar7 = HandleManager::getInterfaceHandle(&this->handles,name_04,FILTER);
    if (pBVar7 != (BasicHandleInfo *)0x0) {
      ActionMessage::setAction(command,cmd_add_endpoint);
      GVar2 = pBVar7->handle;
      (command->dest_id).gid = GVar2.fed_id.gid.gid;
      (command->dest_handle).hid = GVar2.handle.hid.hid;
      (command->payload).bufferSize = 0;
      routeMessage(this,command);
      ActionMessage::setAction(command,cmd_add_filter);
      ActionMessage::swapSourceDest(command);
      sVar3 = pBVar7->type_in->_M_string_length;
      sVar4 = pBVar7->type_out->_M_string_length;
      if (sVar3 != 0 || sVar4 != 0) {
        string1_01._M_str = (pBVar7->type_in->_M_dataplus)._M_p;
        string1_01._M_len = sVar3;
        string2_01._M_str = (pBVar7->type_out->_M_dataplus)._M_p;
        string2_01._M_len = sVar4;
        ActionMessage::setStringData(command,string1_01,string2_01);
      }
      if ((pBVar7->flags & 0x200) != 0) {
        pbVar1 = (byte *)((long)&command->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      goto LAB_00280581;
    }
    break;
  case cmd_add_named_publication:
    name_01._M_str = (char *)(command->payload).heap;
    name_01._M_len = (command->payload).bufferSize;
    pBVar7 = HandleManager::getInterfaceHandle(&this->handles,name_01,PUBLICATION);
    if (pBVar7 != (BasicHandleInfo *)0x0) {
      local_7c.gid = (pBVar7->handle).fed_id.gid;
      _Var8 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::find(&this->mFederates,&local_7c);
      if ((_Var8._M_current)->state < ERROR_STATE) {
        ActionMessage::setAction(command,cmd_add_subscriber);
        GVar2 = pBVar7->handle;
        (command->dest_id).gid = GVar2.fed_id.gid.gid;
        (command->dest_handle).hid = GVar2.handle.hid.hid;
        (command->payload).bufferSize = 0;
        routeMessage(this,command);
        ActionMessage::setAction(command,cmd_add_publisher);
        ActionMessage::swapSourceDest(command);
        name_02._M_str = (pBVar7->key)._M_dataplus._M_p;
        name_02._M_len = (pBVar7->key)._M_string_length;
        ActionMessage::name(command,name_02);
        string1_00._M_str = (pBVar7->type)._M_dataplus._M_p;
        string1_00._M_len = (pBVar7->type)._M_string_length;
        string2_00._M_str = (pBVar7->units)._M_dataplus._M_p;
        string2_00._M_len = (pBVar7->units)._M_string_length;
        ActionMessage::setStringData(command,string1_00,string2_00);
        goto LAB_00280802;
      }
      aVar11 = cmd_add_publisher;
      goto LAB_002805a5;
    }
    break;
  case cmd_add_named_endpoint:
    name_03._M_str = (char *)(command->payload).heap;
    name_03._M_len = (command->payload).bufferSize;
    pBVar7 = HandleManager::getInterfaceHandle(&this->handles,name_03,ENDPOINT);
    if (pBVar7 != (BasicHandleInfo *)0x0) {
      local_7c.gid = (pBVar7->handle).fed_id.gid;
      _Var8 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::find(&this->mFederates,&local_7c);
      if (0x27 < (_Var8._M_current)->state) {
        aVar11 = cmd_add_endpoint;
        goto LAB_002805a5;
      }
      if (command->counter == 0x65) {
        ActionMessage::setAction(command,cmd_add_endpoint);
        uVar6 = command->flags ^ 2;
LAB_002807ac:
        command->flags = uVar6;
      }
      else {
        ActionMessage::setAction(command,cmd_add_filter);
        fed_id_02.fed_id.gid = (command->source_id).gid;
        fed_id_02.handle.hid = (command->source_handle).hid;
        pBVar10 = HandleManager::findHandle(&this->handles,fed_id_02);
        if (pBVar10 != (BasicHandleInfo *)0x0) {
          sVar3 = pBVar10->type_in->_M_string_length;
          sVar4 = pBVar10->type_out->_M_string_length;
          if (sVar3 != 0 || sVar4 != 0) {
            string1_02._M_str = (pBVar10->type_in->_M_dataplus)._M_p;
            string1_02._M_len = sVar3;
            string2_02._M_str = (pBVar10->type_out->_M_dataplus)._M_p;
            string2_02._M_len = sVar4;
            ActionMessage::setStringData(command,string1_02,string2_02);
          }
          if ((pBVar10->flags & 0x200) != 0) {
            uVar6 = command->flags | 0x200;
            goto LAB_002807ac;
          }
        }
      }
      IVar12.hid = (pBVar7->handle).handle.hid;
      command->dest_id = (GlobalFederateId)(pBVar7->handle).fed_id.gid;
      command->dest_handle = (InterfaceHandle)IVar12.hid;
      routeMessage(this,command);
      ActionMessage::setAction(command,cmd_add_endpoint);
      if (command->counter == 0x65) {
        *(byte *)&command->flags = (byte)command->flags ^ 2;
        name_05._M_str = (pBVar7->key)._M_dataplus._M_p;
        name_05._M_len = (pBVar7->key)._M_string_length;
        ActionMessage::name(command,name_05);
        str._M_str = (pBVar7->type)._M_dataplus._M_p;
        str._M_len = (pBVar7->type)._M_string_length;
        ActionMessage::setString(command,0,str);
      }
      ActionMessage::swapSourceDest(command);
      goto LAB_00280802;
    }
  }
  if ((this->super_BrokerBase).field_0x294 != '\x01') {
LAB_00280581:
    routeMessage(this,command);
    return;
  }
  switch(command->messageAction) {
  case cmd_add_named_input:
    target_02.fed_id.gid = (command->source_id).gid;
    target_02.handle.hid = (command->source_handle).hid;
    key_03._M_str = (char *)(command->payload).heap;
    key_03._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addUnknownInput(&this->unknownHandles,key_03,target_02,command->flags);
    if (((command->stringData).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (command->stringData).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (fed_id_00.fed_id.gid = (command->source_id).gid,
       fed_id_00.handle.hid = (command->source_handle).hid,
       pBVar7 = HandleManager::findHandle(&this->handles,fed_id_00),
       pBVar7 == (BasicHandleInfo *)0x0)) {
      fed_id_03.gid = (command->source_id).gid;
      IVar12.hid = (command->source_handle).hid;
      psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
      pcStack_30 = (psVar9->_M_dataplus)._M_p;
      local_38 = psVar9->_M_string_length;
      psVar9 = ActionMessage::getString_abi_cxx11_(command,1);
      pcVar17 = (psVar9->_M_dataplus)._M_p;
      sVar16 = psVar9->_M_string_length;
      what = PUBLICATION;
      pcVar13 = (char *)0x0;
      sVar14 = local_38;
      pcVar15 = pcStack_30;
      local_48 = sVar16;
      pcStack_40 = pcVar17;
LAB_002806c0:
      type._M_str = pcVar15;
      type._M_len = sVar14;
      units._M_str = pcVar17;
      units._M_len = sVar16;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = pcVar13;
      pBVar7 = HandleManager::addHandle
                         (&this->handles,fed_id_03,IVar12,what,(string_view)(auVar5 << 0x40),type,
                          units);
      addLocalInfo(this,pBVar7,command);
      return;
    }
    break;
  case cmd_add_named_filter:
    target_05.fed_id.gid = (command->source_id).gid;
    target_05.handle.hid = (command->source_handle).hid;
    key_06._M_str = (char *)(command->payload).heap;
    key_06._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addUnknownFilter(&this->unknownHandles,key_06,target_05,command->flags);
    return;
  case cmd_add_named_publication:
    target_03.fed_id.gid = (command->source_id).gid;
    target_03.handle.hid = (command->source_handle).hid;
    key_04._M_str = (char *)(command->payload).heap;
    key_04._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addUnknownPublication
              (&this->unknownHandles,key_04,target_03,command->flags);
    return;
  case cmd_add_named_endpoint:
    target_04.fed_id.gid = (command->source_id).gid;
    target_04.handle.hid = (command->source_handle).hid;
    key_05._M_str = (char *)(command->payload).heap;
    key_05._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addUnknownEndpoint(&this->unknownHandles,key_05,target_04,command->flags);
    if (((command->stringData).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (command->stringData).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (fed_id_01.fed_id.gid = (command->source_id).gid,
       fed_id_01.handle.hid = (command->source_handle).hid,
       pBVar7 = HandleManager::findHandle(&this->handles,fed_id_01),
       pBVar7 == (BasicHandleInfo *)0x0)) {
      fed_id_03.gid = (command->source_id).gid;
      IVar12.hid = (command->source_handle).hid;
      psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
      pcStack_50 = (psVar9->_M_dataplus)._M_p;
      local_58 = psVar9->_M_string_length;
      psVar9 = ActionMessage::getString_abi_cxx11_(command,1);
      pcVar17 = (psVar9->_M_dataplus)._M_p;
      sVar16 = psVar9->_M_string_length;
      pcVar13 = "";
      what = FILTER;
      sVar14 = local_58;
      pcVar15 = pcStack_50;
      local_68 = sVar16;
      pcStack_60 = pcVar17;
      goto LAB_002806c0;
    }
    break;
  default:
    local_78 = 0x33;
    pcStack_70 = "unknown command in interface addition code section\n";
    message._M_str = "unknown command in interface addition code section\n";
    message._M_len = 0x33;
    name_06._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name_06._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name_06,
               message,false);
  }
  return;
}

Assistant:

void CoreBroker::checkForNamedInterface(ActionMessage& command)
{
    bool foundInterface = false;
    if (checkActionFlag(command, reconnectable_flag)) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addReconnectablePublication(command.name(),
                                                               command.getSource(),
                                                               command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addReconnectableInput(command.name(),
                                                         command.getSource(),
                                                         command.flags);

                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addReconnectableEndpoint(command.name(),
                                                            command.getSource(),
                                                            command.flags);

                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addReconnectableFilter(command.name(),
                                                          command.getSource(),
                                                          command.flags);
                    break;
                default:
                    break;
            }
        }
    }
    switch (command.action()) {
        case CMD_ADD_NAMED_PUBLICATION: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                auto fed = mFederates.find(pub->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.setDestination(pub->handle);
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.swapSourceDest();
                    command.name(pub->key);
                    command.setStringData(pub->type, pub->units);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_PUBLISHER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(pub->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_INPUT: {
            auto* inp = handles.getInterfaceHandle(command.name(), InterfaceType::INPUT);
            if (inp != nullptr) {
                auto fed = mFederates.find(inp->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.setDestination(inp->handle);
                    auto* pub = handles.findHandle(command.getSource());
                    if (pub != nullptr) {
                        command.setStringData(pub->type, pub->units);
                    }
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.swapSourceDest();
                    command.clearStringData();
                    command.name(inp->key);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(inp->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_FILTER: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.setAction(CMD_ADD_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_ADD_FILTER);
                command.swapSourceDest();
                if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                    command.setStringData(filt->type_in, filt->type_out);
                }
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(command, clone_flag);
                }
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_ENDPOINT: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                auto fed = mFederates.find(ept->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        command.setAction(CMD_ADD_ENDPOINT);
                        toggleActionFlag(command, destination_target);
                    } else {
                        command.setAction(CMD_ADD_FILTER);
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt != nullptr) {
                            if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                                command.setStringData(filt->type_in, filt->type_out);
                            }
                            if (checkActionFlag(*filt, clone_flag)) {
                                setActionFlag(command, clone_flag);
                            }
                        }
                    }
                    command.setDestination(ept->handle);
                    routeMessage(command);
                    command.setAction(CMD_ADD_ENDPOINT);
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        toggleActionFlag(command, destination_target);
                        command.name(ept->key);
                        command.setString(typeStringLoc, ept->type);
                    }
                    command.swapSourceDest();
                    // command.setSource(ept->handle);

                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_ENDPOINT);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(ept->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        default:
            break;
    }

    if (!foundInterface) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addUnknownPublication(command.name(),
                                                         command.getSource(),
                                                         command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addUnknownInput(command.name(),
                                                   command.getSource(),
                                                   command.flags);
                    if (!command.getStringData().empty()) {
                        auto* pub = handles.findHandle(command.getSource());
                        if (pub == nullptr) {
                            // an anonymous publisher is adding an input
                            auto& apub = handles.addHandle(command.source_id,
                                                           command.source_handle,
                                                           InterfaceType::PUBLICATION,
                                                           std::string_view(),
                                                           command.getString(typeStringLoc),
                                                           command.getString(unitStringLoc));

                            addLocalInfo(apub, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addUnknownEndpoint(command.name(),
                                                      command.getSource(),
                                                      command.flags);
                    if (!command.getStringData().empty()) {
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt == nullptr) {
                            // an anonymous filter is adding an endpoint
                            auto& afilt = handles.addHandle(command.source_id,
                                                            command.source_handle,
                                                            InterfaceType::FILTER,
                                                            "",
                                                            command.getString(typeStringLoc),
                                                            command.getString(typeOutStringLoc));

                            addLocalInfo(afilt, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addUnknownFilter(command.name(),
                                                    command.getSource(),
                                                    command.flags);
                    break;
                default:
                    LOG_WARNING(global_broker_id_local,
                                getIdentifier(),
                                "unknown command in interface addition code section\n");
                    break;
            }
        } else {
            routeMessage(command);
        }
    }
}